

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.cpp
# Opt level: O1

tuple<std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
__thiscall sai::Document::GetThumbnail(Document *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__s;
  __uniq_ptr_data<std::byte,_std::default_delete<std::byte[]>,_true,_true> extraout_RDX;
  tuple<std::byte_*,_std::default_delete<std::byte[]>_> extraout_RDX_00;
  tuple<std::byte_*,_std::default_delete<std::byte[]>_> extraout_RDX_01;
  unique_ptr<std::byte[],_std::default_delete<std::byte[]>_> extraout_RDX_02;
  _Head_base<0UL,_std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_false> _Var2;
  VirtualFileSystem *in_RSI;
  __extent_storage<18446744073709551615UL> __n;
  tuple<std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
  tVar3;
  span<std::byte,_18446744073709551615UL> Destination;
  span<std::byte,_18446744073709551615UL> Destination_00;
  span<std::byte,_18446744073709551615UL> Destination_01;
  span<std::byte,_18446744073709551615UL> Destination_02;
  ThumbnailHeader Header;
  optional<sai::VirtualFileEntry> Thumbnail;
  int local_9c;
  int local_98;
  int local_94;
  optional<sai::VirtualFileEntry> local_90;
  
  VirtualFileSystem::GetEntry(&local_90,in_RSI,"thumbnail");
  bVar1 = local_90.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
          super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
          super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged;
  _Var2._M_head_impl._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>._M_t.
  super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
  super__Head_base<0UL,_std::byte_*,_false>._M_head_impl =
       (unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>)
       (unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>)
       extraout_RDX.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>._M_t.
       super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
       super__Head_base<0UL,_std::byte_*,_false>._M_head_impl;
  if (local_90.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
      super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
      super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged == true) {
    Destination._M_extent._M_extent_value = 4;
    Destination._M_ptr = (pointer)&local_9c;
    VirtualFileEntry::Read((VirtualFileEntry *)&local_90,Destination);
    Destination_00._M_extent._M_extent_value = 4;
    Destination_00._M_ptr = (pointer)&local_98;
    VirtualFileEntry::Read((VirtualFileEntry *)&local_90,Destination_00);
    Destination_01._M_extent._M_extent_value = 4;
    Destination_01._M_ptr = (pointer)&local_94;
    VirtualFileEntry::Read((VirtualFileEntry *)&local_90,Destination_01);
    if (local_94 == 0x32334d42) {
      __n._M_extent_value = (ulong)(uint)(local_9c * local_98) << 2;
      __s = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(__n._M_extent_value);
      memset(__s,0,__n._M_extent_value);
      Destination_02._M_extent._M_extent_value = __n._M_extent_value;
      Destination_02._M_ptr = (pointer)__s;
      VirtualFileEntry::Read((VirtualFileEntry *)&local_90,Destination_02);
      *(int *)&(this->super_VirtualFileSystem).FileStream.
               super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98;
      *(int *)((long)&(this->super_VirtualFileSystem).FileStream.
                      super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
           local_9c;
      (this->super_VirtualFileSystem).FileStream.
      super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = __s;
      _Var2._M_head_impl._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>.
      _M_t.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
      super__Head_base<0UL,_std::byte_*,_false>._M_head_impl =
           (unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>)
           (unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>)
           extraout_RDX_01.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
           super__Head_base<0UL,_std::byte_*,_false>._M_head_impl;
    }
    else {
      (this->super_VirtualFileSystem).FileStream.
      super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (this->super_VirtualFileSystem).FileStream.
      super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var2._M_head_impl._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>.
      _M_t.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
      super__Head_base<0UL,_std::byte_*,_false>._M_head_impl =
           (unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>)
           (unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>)
           extraout_RDX_00.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
           super__Head_base<0UL,_std::byte_*,_false>._M_head_impl;
    }
  }
  if (local_90.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
      super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
      super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged == true) {
    local_90.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
    super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
    super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged = false;
    VirtualFileEntry::~VirtualFileEntry((VirtualFileEntry *)&local_90);
    _Var2._M_head_impl._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>._M_t
    .super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
    super__Head_base<0UL,_std::byte_*,_false>._M_head_impl =
         (unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>)
         (unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>)
         extraout_RDX_02._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>.
         _M_t.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
         super__Head_base<0UL,_std::byte_*,_false>._M_head_impl;
  }
  if (bVar1 == false) {
    (this->super_VirtualFileSystem).FileStream.
    super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (this->super_VirtualFileSystem).FileStream.
    super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  tVar3.
  super__Tuple_impl<0UL,_std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
  .super__Head_base<0UL,_std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_false>.
  _M_head_impl._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>._M_t.
  super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
  super__Head_base<0UL,_std::byte_*,_false>._M_head_impl =
       _Var2._M_head_impl._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>.
       _M_t.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
       super__Head_base<0UL,_std::byte_*,_false>._M_head_impl;
  tVar3.
  super__Tuple_impl<0UL,_std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
  .super__Tuple_impl<1UL,_unsigned_int,_unsigned_int> =
       (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)this;
  return (tuple<std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
          )tVar3.
           super__Tuple_impl<0UL,_std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
  ;
}

Assistant:

std::tuple<std::unique_ptr<std::byte[]>, std::uint32_t, std::uint32_t> Document::GetThumbnail()
{
	if( std::optional<VirtualFileEntry> Thumbnail = GetEntry("thumbnail"); Thumbnail )
	{
		ThumbnailHeader Header;
		Thumbnail->Read(Header.Width);
		Thumbnail->Read(Header.Height);
		Thumbnail->Read(Header.Magic);

		if( Header.Magic != sai::Tag<std::endian::little>("BM32") )
		{
			return std::make_tuple(nullptr, 0, 0);
		}

		const std::size_t            PixelCount = Header.Height * Header.Width;
		std::unique_ptr<std::byte[]> Pixels
			= std::make_unique<std::byte[]>(PixelCount * sizeof(std::uint32_t));

		Thumbnail->Read({Pixels.get(), PixelCount * sizeof(std::uint32_t)});

#if 0
		//// BGRA to RGBA
		std::size_t i = 0;

		//// Simd speedup, four pixels at a time
		while( i < ((PixelCount * sizeof(std::uint32_t)) & ~0xF) )
		{
			const __m128i Swizzle
				= _mm_set_epi8(15, 12, 13, 14, 11, 8, 9, 10, 7, 4, 5, 6, 3, 0, 1, 2);

			__m128i QuadPixel = _mm_loadu_si128(reinterpret_cast<__m128i*>(&Pixels[i]));

			QuadPixel = _mm_shuffle_epi8(QuadPixel, Swizzle);

			_mm_store_si128(reinterpret_cast<__m128i*>(&Pixels[i]), QuadPixel);

			i += (sizeof(std::uint32_t) * 4);
		}

		for( ; i < PixelCount * sizeof(std::uint32_t); i += sizeof(std::uint32_t) )
		{
			std::swap<std::byte>(Pixels[i], Pixels[i + 2]);
		}
#endif

		return std::make_tuple(std::move(Pixels), Header.Width, Header.Height);
	}
	return std::make_tuple(nullptr, 0, 0);
}